

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

char * flatcc_json_printer_error_string(int err)

{
  if ((uint)err < 4) {
    return &DAT_0012773c + *(int *)(&DAT_0012773c + (ulong)(uint)err * 4);
  }
  return "unknown";
}

Assistant:

const char *flatcc_json_printer_error_string(int err)
{
    switch (err) {
#define XX(no, str)                                                         \
    case flatcc_json_printer_error_##no:                                    \
        return str;
        FLATCC_JSON_PRINT_ERROR_MAP(XX)
#undef XX
    default:
        return "unknown";
    }
}